

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingVertexShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_vertex_shader_code)

{
  ostream *poVar1;
  void *this_00;
  string local_240 [36];
  uint local_21c;
  uint local_218;
  GLuint i_1;
  GLuint i;
  stringstream local_208 [8];
  stringstream stream;
  ostream local_1f8;
  undefined1 local_80 [8];
  string sampling_code;
  GLchar *sampler_type_str;
  attributeDefinition *type_attribute_definitions;
  attributeDefinition *routine_attribute_definitions;
  GLuint n_type_attributes;
  GLuint n_routine_attributes;
  GLuint n_components;
  bool is_shadow_sampler;
  GLchar *interpolation_type;
  GLchar *color_type;
  string *out_vertex_shader_code_local;
  samplingFunction *sampling_function_local;
  samplerType *sampler_type_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  interpolation_type = (GLchar *)0x0;
  _n_components = (char *)0x0;
  n_routine_attributes._3_1_ = 0;
  n_type_attributes = 0;
  routine_attribute_definitions._4_4_ = 0;
  routine_attribute_definitions._0_4_ = 0;
  type_attribute_definitions = (attributeDefinition *)0x0;
  sampler_type_str = (GLchar *)0x0;
  sampling_code.field_2._8_8_ = 0;
  color_type = (GLchar *)out_vertex_shader_code;
  out_vertex_shader_code_local = (string *)sampling_function;
  sampling_function_local = sampler_type;
  sampler_type_local = (samplerType *)this;
  std::__cxx11::string::string((string *)local_80);
  std::__cxx11::stringstream::stringstream(local_208);
  getAttributes(*(samplingFunction *)out_vertex_shader_code_local,&type_attribute_definitions,
                (GLuint *)((long)&routine_attribute_definitions + 4));
  getAttributes(*sampling_function_local,(attributeDefinition **)&sampler_type_str,
                (GLuint *)&routine_attribute_definitions);
  getColorType(this,*sampling_function_local,&interpolation_type,(GLchar **)&n_components,
               (GLchar **)((long)&sampling_code.field_2 + 8),&n_type_attributes,
               (bool *)((long)&n_routine_attributes + 3));
  if ((n_routine_attributes._3_1_ & 1) == 0) {
    getSamplingFunctionCall
              (this,*(samplingFunction *)out_vertex_shader_code_local,interpolation_type,
               n_type_attributes,"vs_in_",(GLchar *)0x0,"fs_in_color",(GLchar *)0x0,"sampler",
               (string *)local_80);
  }
  else {
    getShadowSamplingFunctionCall
              (this,*(samplingFunction *)out_vertex_shader_code_local,interpolation_type,
               n_type_attributes,"vs_in_",(GLchar *)0x0,"fs_in_color",(GLchar *)0x0,"sampler",
               (string *)local_80);
  }
  poVar1 = std::operator<<(&local_1f8,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n");
  poVar1 = std::operator<<(poVar1,"precision highp float;\n");
  poVar1 = std::operator<<(poVar1,"/* Sampling vertex shader */");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(&local_1f8,"uniform ");
  poVar1 = std::operator<<(poVar1,"highp ");
  poVar1 = std::operator<<(poVar1,(char *)sampling_code.field_2._8_8_);
  poVar1 = std::operator<<(poVar1,"sampler");
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&local_1f8,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(&local_1f8,"in ");
  poVar1 = std::operator<<(poVar1,"vec4 ");
  poVar1 = std::operator<<(poVar1,"vs_in_");
  poVar1 = std::operator<<(poVar1,"position");
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_218 = 0; local_218 < routine_attribute_definitions._4_4_; local_218 = local_218 + 1) {
    poVar1 = std::operator<<(&local_1f8,"in ");
    poVar1 = std::operator<<(poVar1,type_attribute_definitions[local_218].type);
    poVar1 = std::operator<<(poVar1,"vs_in_");
    poVar1 = std::operator<<(poVar1,type_attribute_definitions[local_218].name);
    poVar1 = std::operator<<(poVar1,";");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (local_21c = 0; local_21c < (uint)routine_attribute_definitions; local_21c = local_21c + 1) {
    poVar1 = std::operator<<(&local_1f8,"in ");
    poVar1 = std::operator<<(poVar1,*(char **)(sampler_type_str + (ulong)local_21c * 0x18 + 8));
    poVar1 = std::operator<<(poVar1,"vs_in_");
    poVar1 = std::operator<<(poVar1,*(char **)(sampler_type_str + (ulong)local_21c * 0x18));
    poVar1 = std::operator<<(poVar1,";");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<(&local_1f8,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(&local_1f8,_n_components);
  poVar1 = std::operator<<(poVar1,"out ");
  poVar1 = std::operator<<(poVar1,interpolation_type);
  poVar1 = std::operator<<(poVar1,"fs_in_color");
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&local_1f8,std::endl<char,std::char_traits<char>>);
  std::operator<<(&local_1f8,
                  "void main()\n{\n    gl_PointSize = 1.0f;\n    gl_Position = vs_in_position;\n");
  std::operator<<(&local_1f8,(string *)local_80);
  poVar1 = std::operator<<(&local_1f8,"}");
  this_00 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)color_type,local_240);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::stringstream::~stringstream(local_208);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingVertexShaderCode(const samplerType&	  sampler_type,
																  const samplingFunction& sampling_function,
																  std::string&			  out_vertex_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_input, 0,
								fragment_shader_input, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, vertex_shader_input, 0,
									  fragment_shader_input, 0, sampler_name, sampling_code);
	}

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Sampling vertex shader */" << std::endl;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	stream << std::endl;

	/* in vec4 vs_in_position */
	stream << shader_input << type_vec4 << vertex_shader_input << vertex_shader_position << ";" << std::endl;

	/* in type attribute */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << shader_input << routine_attribute_definitions[i].type << vertex_shader_input
			   << routine_attribute_definitions[i].name << ";" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << shader_input << type_attribute_definitions[i].type << vertex_shader_input
			   << type_attribute_definitions[i].name << ";" << std::endl;
	}

	stream << std::endl;

	/* out vec4 fs_in_color; */
	stream << interpolation_type << shader_output << color_type << fragment_shader_input << ";" << std::endl;

	stream << std::endl;

	/* Body */
	stream << vertex_shader_body_code;

	/* Sampling code */
	stream << sampling_code;

	stream << "}" << std::endl << std::endl;

	/* Store result */
	out_vertex_shader_code = stream.str();
}